

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestSha256.cpp
# Opt level: O0

void testSha256(void)

{
  code *pcVar1;
  int iVar2;
  undefined8 local_68;
  byte check2 [32];
  byte checksum [32];
  byte check1 [32];
  
  checksum[0x18] = 0xe3;
  checksum[0x19] = 0xb0;
  checksum[0x1a] = 0xc4;
  checksum[0x1b] = 'B';
  checksum[0x1c] = 0x98;
  checksum[0x1d] = 0xfc;
  checksum[0x1e] = '\x1c';
  checksum[0x1f] = '\x14';
  Sha256::hash("",0,(byte (*) [32])(check2 + 0x18));
  iVar2 = Memory::compare(check2 + 0x18,checksum + 0x18,0x20);
  if (iVar2 != 0) {
    iVar2 = Debug::printf("%s:%u: assertion failed: %s\n",
                          "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestSha256.cpp"
                          ,0xc,"Memory::compare(checksum, check1, sizeof(check1)) == 0");
    if (iVar2 != 0) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
  }
  local_68 = 0x878d4d6abe0f935c;
  check2[0] = 0xd8;
  check2[1] = 0x98;
  check2[2] = '[';
  check2[3] = '-';
  check2[4] = '(';
  check2[5] = 0xad;
  check2[6] = 'k';
  check2[7] = '0';
  check2[8] = 0xa9;
  check2[9] = 0xba;
  check2[10] = 0x93;
  check2[0xb] = 0xfb;
  check2[0xc] = '\x05';
  check2[0xd] = '~';
  check2[0xe] = '\x14';
  check2[0xf] = 0x9c;
  check2[0x10] = 0x96;
  check2[0x11] = 0xca;
  check2[0x12] = 0x82;
  check2[0x13] = 'm';
  check2[0x14] = 0xe7;
  check2[0x15] = 'z';
  check2[0x16] = 'P';
  check2[0x17] = 0xa8;
  Sha256::hash((byte *)"But First, We Need to Talk About Parallel Universes",0x33,
               (byte (*) [32])(check2 + 0x18));
  iVar2 = Memory::compare(check2 + 0x18,&local_68,0x20);
  if (iVar2 != 0) {
    iVar2 = Debug::printf("%s:%u: assertion failed: %s\n",
                          "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestSha256.cpp"
                          ,0x11,"Memory::compare(checksum, check2, sizeof(check2)) == 0");
    if (iVar2 != 0) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
  }
  return;
}

Assistant:

void testSha256()
{
  byte check1[Sha256::digestSize] = {
    0xe3, 0xb0, 0xc4, 0x42, 0x98, 0xfc, 0x1c, 0x14, 0x9a, 0xfb, 0xf4, 0xc8, 0x99, 0x6f, 0xb9, 0x24, 0x27, 0xae, 0x41, 0xe4, 0x64, 0x9b, 0x93, 0x4c, 0xa4, 0x95, 0x99, 0x1b, 0x78, 0x52, 0xb8, 0x55
  };
  byte checksum[Sha256::digestSize];
  Sha256::hash((const byte*)"", 0, checksum);
  ASSERT(Memory::compare(checksum, check1, sizeof(check1)) == 0);
  byte check2[Sha256::digestSize] = {
    0x5c, 0x93, 0x0f, 0xbe, 0x6a, 0x4d, 0x8d, 0x87, 0xd8, 0x98, 0x5b, 0x2d, 0x28, 0xad, 0x6b, 0x30, 0xa9, 0xba, 0x93, 0xfb, 0x05, 0x7e, 0x14, 0x9c, 0x96, 0xca, 0x82, 0x6d, 0xe7, 0x7a, 0x50, 0xa8
  };
  Sha256::hash((const byte*)"But First, We Need to Talk About Parallel Universes", 51, checksum);
  ASSERT(Memory::compare(checksum, check2, sizeof(check2)) == 0);
}